

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall
pstore::file::deleter_base::deleter_base(deleter_base *this,string *path,unlink_proc *unlinker)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->_vptr_deleter_base = (_func_int **)&PTR__deleter_base_00197888;
  paVar1 = &(this->path_).field_2;
  (this->path_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (path->_M_dataplus)._M_p;
  paVar2 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&path->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->path_).field_2 + 8) = uVar4;
  }
  else {
    (this->path_)._M_dataplus._M_p = pcVar3;
    (this->path_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->path_)._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar2;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  (this->unlinker_).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->unlinker_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->unlinker_).super__Function_base._M_functor + 8) = 0;
  (this->unlinker_)._M_invoker = unlinker->_M_invoker;
  if ((unlinker->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)((long)&(unlinker->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->unlinker_).super__Function_base._M_functor =
         *(undefined8 *)&(unlinker->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->unlinker_).super__Function_base._M_functor + 8) = uVar4;
    (this->unlinker_).super__Function_base._M_manager = (unlinker->super__Function_base)._M_manager;
    (unlinker->super__Function_base)._M_manager = (_Manager_type)0x0;
    unlinker->_M_invoker = (_Invoker_type)0x0;
  }
  this->released_ = false;
  return;
}

Assistant:

deleter_base::deleter_base (std::string path, unlink_proc unlinker)
                : path_{std::move (path)}
                , unlinker_{std::move (unlinker)} {}